

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O1

Try<bool> * __thiscall
async_simple::coro::detail::LazyPromise<bool>::tryResult
          (Try<bool> *__return_storage_ptr__,LazyPromise<bool> *this)

{
  variant_alternative_t<1UL,_variant<monostate,_bool,_exception_ptr>_> *pvVar1;
  
  if (*(__index_type *)
       ((long)&(this->_value).
               super__Variant_base<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
               super__Move_assign_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
               super__Copy_assign_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
               super__Move_ctor_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
               super__Copy_ctor_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
               super__Variant_storage_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>
       + 8) == '\x02') {
    std::get<2ul,std::monostate,bool,std::__exception_ptr::exception_ptr>(&this->_value);
    tryResult();
  }
  else {
    pvVar1 = std::get<1ul,std::monostate,bool,std::__exception_ptr::exception_ptr>(&this->_value);
    *(variant_alternative_t<1UL,_variant<monostate,_bool,_exception_ptr>_> *)
     &(__return_storage_ptr__->_value).
      super__Variant_base<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
      super__Move_assign_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
      super__Copy_assign_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
      super__Move_ctor_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
      super__Copy_ctor_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
      super__Variant_storage_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr> =
         *pvVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->_value).
             super__Variant_base<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
             super__Move_assign_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
             super__Copy_assign_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
             super__Move_ctor_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
             super__Copy_ctor_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>.
             super__Variant_storage_alias<std::monostate,_bool,_std::__exception_ptr::exception_ptr>
     + 8) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }